

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

Vec_Int_t * Gia_ManCorrCreateRemapping(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  int Entry;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  iVar2 = p->nRegs;
  if (0 < iVar2) {
    Entry = 0;
    do {
      iVar1 = p->vCis->nSize;
      iVar2 = iVar1 - iVar2;
      uVar4 = Entry + iVar2;
      if (((int)uVar4 < 0) || (iVar1 <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCis->pArray[uVar4];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_006407da:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      uVar6 = (ulong)(uint)p->pReprs[iVar1] & 0xfffffff;
      if (uVar6 == 0xfffffff) {
        pGVar5 = (Gia_Obj_t *)0x0;
      }
      else {
        if (p->nObjs <= (int)uVar6) goto LAB_006407da;
        pGVar5 = p->pObjs + uVar6;
      }
      if (((pGVar5 != (Gia_Obj_t *)0x0) && (((uint)p->pReprs[iVar1] >> 0x1d & 1) == 0)) &&
         (uVar6 = *(ulong *)pGVar5, (uVar6 & 0x1fffffff1fffffff) != 0x1fffffff1fffffff)) {
        if (((~(uint)uVar6 & 0x9fffffff) != 0) ||
           (uVar4 = (uint)(uVar6 >> 0x20), (int)(uVar4 & 0x1fffffff) < iVar2)) {
          __assert_fail("Gia_ObjIsRo(p, pRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                        ,0x177,"Vec_Int_t *Gia_ManCorrCreateRemapping(Gia_Man_t *)");
        }
        Vec_IntPush(p_00,(uVar4 & 0x1fffffff) - iVar2);
        Vec_IntPush(p_00,Entry);
      }
      Entry = Entry + 1;
      iVar2 = p->nRegs;
    } while (Entry < iVar2);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCorrCreateRemapping( Gia_Man_t * p )
{
    Vec_Int_t * vPairs;
    Gia_Obj_t * pObj, * pRepr;
    int i;
    vPairs = Vec_IntAlloc( 100 );
    Gia_ManForEachRo( p, pObj, i )
    {
        // skip ROs without representatives
        pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
        if ( pRepr == NULL || Gia_ObjIsConst0(pRepr) || Gia_ObjFailed(p, Gia_ObjId(p,pObj)) )
//        if ( pRepr == NULL || Gia_ObjIsConst0(pRepr) || Gia_ObjIsFailedPair(p, Gia_ObjId(p, pRepr), Gia_ObjId(p, pObj)) )
            continue;
        assert( Gia_ObjIsRo(p, pRepr) );
//        Abc_Print( 1, "%d -> %d    ", Gia_ObjId(p,pObj), Gia_ObjId(p, pRepr) );
        // remember the pair
        Vec_IntPush( vPairs, Gia_ObjCioId(pRepr) - Gia_ManPiNum(p) );
        Vec_IntPush( vPairs, i );
    }
    return vPairs;
}